

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O1

void __thiscall
hedg::Publisher::Publisher
          (Publisher *this,MarketGenerator *market_gen,
          unique_ptr<hedg::Market_Handler,_std::default_delete<hedg::Market_Handler>_> *handler,
          io_service *service,context *context,int max_markets,int time_span)

{
  _Elt_pointer piVar1;
  pointer __p;
  int iVar2;
  vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  local_78;
  deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  *local_58;
  condition_variable *local_50;
  vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  local_48;
  
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 8) = 0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->data_cond_);
  this->market_gen_ = market_gen;
  this->handler_ = handler;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map = (_Map_pointer)0x0;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_cur = (_Elt_pointer)0x0;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_first = (_Elt_pointer)0x0;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_last = (_Elt_pointer)0x0;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_start._M_node = (_Map_pointer)0x0;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_cur = (_Elt_pointer)0x0;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_first = (_Elt_pointer)0x0;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_last = (_Elt_pointer)0x0;
  (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
  _M_finish._M_node = (_Map_pointer)0x0;
  local_50 = &this->data_cond_;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)&this->free_socks_,0);
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->socks).
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->socks).
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->socks).
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sock_flags).super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>::_M_initialize_map
            (&(this->sock_flags).
              super__Deque_base<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>,0);
  (this->order_socket_)._M_t.
  super___uniq_ptr_impl<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_hedg::Client<hedg::Stream_Client>_*,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  .super__Head_base<0UL,_hedg::Client<hedg::Stream_Client>_*,_false>._M_head_impl =
       (Client<hedg::Stream_Client> *)0x0;
  local_58 = &this->subscribed_;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->subscribed_).
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ::_M_initialize_map(&local_58->
                       super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                      ,0);
  (this->last_ids)._M_h._M_buckets = &(this->last_ids)._M_h._M_single_bucket;
  (this->last_ids)._M_h._M_bucket_count = 1;
  (this->last_ids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->last_ids)._M_h._M_element_count = 0;
  (this->last_ids)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->last_ids)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->last_ids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->max_markets_ = max_markets;
  this->time_span_ = time_span;
  utils::create_streamers(&local_48,service,context,max_markets);
  local_78.
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->socks).
       super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->socks).
       super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->socks).
       super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->socks).
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->socks).
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->socks).
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ::~vector(&local_48);
  local_78.
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78.
                        super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  if (0 < this->max_markets_) {
    do {
      local_48.
      super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_48.
                            super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      std::deque<std::atomic<bool>,_std::allocator<std::atomic<bool>_>_>::emplace_back<int>
                (&this->sock_flags,(int *)&local_48);
      piVar1 = (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (piVar1 == (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)&this->free_socks_,(int *)&local_78);
      }
      else {
        *piVar1 = (int)local_78.
                       super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        (this->free_socks_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur = piVar1 + 1;
      }
      iVar2 = (int)local_78.
                   super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
      local_78.
      super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_78.
                             super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2);
    } while (iVar2 < this->max_markets_);
  }
  utils::new_streamer((utils *)&local_78,service,context);
  __p = local_78.
        super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>,_std::allocator<std::unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  __uniq_ptr_impl<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  ::reset((__uniq_ptr_impl<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
           *)&this->order_socket_,(pointer)__p);
  std::
  unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
  ::~unique_ptr((unique_ptr<hedg::Client<hedg::Stream_Client>,_std::default_delete<hedg::Client<hedg::Stream_Client>_>_>
                 *)&local_78);
  LOCK();
  (this->order_socket_flag)._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

Publisher::Publisher(MarketGenerator& market_gen, std::unique_ptr<Market_Handler>& handler, 
	io_service& service, ssl::context& context, int max_markets, int time_span) :
	market_gen_{ market_gen }, handler_{ handler }, max_markets_{ max_markets }, time_span_{ time_span } {
	socks = utils::create_streamers(service, context, max_markets_);

	for (int i = 0; i < max_markets_; ++i) {
		sock_flags.emplace_back(0);
		free_socks_.push(i);
	}
	order_socket_ = utils::new_streamer(service, context);
	order_socket_flag = 0;
	
}